

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<cmd_result<ptr<buffer>_>_> pVar1;
  ptr<req_msg> req;
  ptr<log_entry> log;
  undefined4 local_7c;
  int local_78 [2];
  ptr<buffer> buf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Any_data local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  srv_config::serialize((srv_config *)&buf);
  local_48._M_unused._M_member_pointer = (ulong)(uint)local_48._4_4_ << 0x20;
  req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 3;
  std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
            ((int *)&log,(shared_ptr<nuraft::buffer> *)&local_48,(log_val_type *)&buf);
  local_48._M_unused._M_object = (pointer)0x0;
  local_78[1] = 6;
  local_78[0] = 0;
  local_7c = 0;
  local_58._8_8_ = 0;
  local_58._M_allocated_capacity = 0;
  std::
  make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)&req,(msg_type *)local_48._M_pod_data,local_78 + 1,local_78,
             (unsigned_long *)&local_7c,(unsigned_long *)(local_58._M_local_buf + 8),
             &local_58._M_allocated_capacity);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)(CONCAT71(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _1_7_,req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_1_) + 0x38),&log);
  local_28._0_1_ = false;
  local_28._1_3_ = 0;
  local_28._4_4_ = 0;
  uStack_20 = 0;
  local_38._M_allocated_capacity = 0;
  local_38._8_8_ = 0;
  local_48._M_unused._M_object = (pointer)0x0;
  local_48._8_8_ = 0;
  send_msg_to_leader(this,(ptr<req_msg> *)srv,(req_ext_params *)&req);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar1.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::add_srv(const srv_config& srv)
{
    ptr<buffer> buf(srv.serialize());
    ptr<log_entry> log( cs_new<log_entry>
                        ( 0, buf, log_val_type::cluster_server ) );
    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::add_server_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 );
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}